

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O0

void __thiscall rcg::System::clearInterfaces(System *this)

{
  size_type sVar1;
  element_type *this_00;
  int __fd;
  long in_RDI;
  size_t i;
  undefined8 local_10;
  ulong uVar2;
  
  local_10 = 0;
  while( true ) {
    sVar1 = std::
            vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
            ::size((vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                    *)(in_RDI + 0x98));
    if (sVar1 <= local_10) break;
    uVar2 = local_10;
    std::vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
    ::operator[]((vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                  *)(in_RDI + 0x98),local_10);
    __fd = (int)uVar2;
    this_00 = std::__shared_ptr_access<rcg::Interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<rcg::Interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x110ce2);
    Interface::close(this_00,__fd);
    local_10 = local_10 + 1;
  }
  std::vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>::
  clear((vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
         *)0x110d0b);
  return;
}

Assistant:

void System::clearInterfaces()
{
  // close and clear all interfaces as part of ENUM-WORKAROUND
  for (size_t i=0; i<ilist.size(); i++)
  {
    ilist[i]->close();
  }

  ilist.clear();
}